

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::FindExtensionInfoFromFieldNumber
          (ExtensionSet *this,int wire_type,int field_number,ExtensionFinder *extension_finder,
          ExtensionInfo *extension,bool *was_packed_on_wire)

{
  uint uVar1;
  int iVar2;
  FieldType FVar3;
  LogMessage *other;
  bool bVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  iVar2 = (*extension_finder->_vptr_ExtensionFinder[2])
                    (extension_finder,(ulong)(uint)field_number,extension);
  if ((char)iVar2 == '\0') {
    bVar4 = false;
  }
  else {
    FVar3 = anon_unknown_29::real_type(extension->type);
    uVar1 = *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)FVar3 * 4);
    *was_packed_on_wire = false;
    if ((wire_type == 2) && (extension->is_repeated != false)) {
      if (uVar1 < 6) {
        if ((0x1cU >> (uVar1 & 0x1f) & 1) == 0) {
          *was_packed_on_wire = true;
          return true;
        }
      }
      else {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x4a);
        other = LogMessage::operator<<(&local_58,"can\'t reach here.");
        LogFinisher::operator=(&local_59,other);
        LogMessage::~LogMessage(&local_58);
      }
    }
    bVar4 = uVar1 == wire_type;
  }
  return bVar4;
}

Assistant:

bool ExtensionSet::FindExtensionInfoFromFieldNumber(
    int wire_type, int field_number, ExtensionFinder* extension_finder,
    ExtensionInfo* extension, bool* was_packed_on_wire) {
  if (!extension_finder->Find(field_number, extension)) {
    return false;
  }

  WireFormatLite::WireType expected_wire_type =
      WireFormatLite::WireTypeForFieldType(real_type(extension->type));

  // Check if this is a packed field.
  *was_packed_on_wire = false;
  if (extension->is_repeated &&
      wire_type == WireFormatLite::WIRETYPE_LENGTH_DELIMITED &&
      is_packable(expected_wire_type)) {
    *was_packed_on_wire = true;
    return true;
  }
  // Otherwise the wire type must match.
  return expected_wire_type == wire_type;
}